

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

void __thiscall
icu_63::FixedDecimal::adjustForMinFractionDigits(FixedDecimal *this,int32_t minFractionDigits)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->visibleDecimalDigitCount;
  if (iVar1 < minFractionDigits) {
    lVar2 = this->decimalDigits;
    do {
      if (99999999999999999 < lVar2) break;
      lVar2 = lVar2 * 10;
      this->decimalDigits = lVar2;
      iVar1 = iVar1 + 1;
    } while (minFractionDigits != iVar1);
    this->visibleDecimalDigitCount = minFractionDigits;
  }
  return;
}

Assistant:

void FixedDecimal::adjustForMinFractionDigits(int32_t minFractionDigits) {
    int32_t numTrailingFractionZeros = minFractionDigits - visibleDecimalDigitCount;
    if (numTrailingFractionZeros > 0) {
        for (int32_t i=0; i<numTrailingFractionZeros; i++) {
            // Do not let the decimalDigits value overflow if there are many trailing zeros.
            // Limit the value to 18 digits, the most that a 64 bit int can fully represent.
            if (decimalDigits >= 100000000000000000LL) {
                break;
            }
            decimalDigits *= 10;
        }
        visibleDecimalDigitCount += numTrailingFractionZeros;
    }
}